

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedSharedIndexing::Run(AdvancedSharedIndexing *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  undefined1 auVar1 [16];
  bool bVar2;
  GLuint GVar3;
  undefined4 extraout_EAX;
  int iVar4;
  bool *compile_error;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  allocator<char> local_59;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Vector<float,_4> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,
             "\nlayout(binding = 3, rgba32f) uniform image2D g_result_image;\nlayout (local_size_x = 4,local_size_y=4 ) in;\nshared vec4 g_shared1[4];\nshared mat4 g_shared2;\nshared struct {\n  float data[4];\n} g_shared3[4];\nshared struct Type { float data[4]; } g_shared4[4];\nshared Type g_shared5[4];\nuniform bool g_true = true;\nuniform float g_values[16] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };\n\nvoid Sync() {\n  groupMemoryBarrier();\n  barrier();\n}\nvoid SetMemory(ivec2 xy, float value) {\n  g_shared1[xy.y][gl_LocalInvocationID.x] = value;\n  g_shared2[xy.y][xy.x] = value;\n  g_shared3[xy[1]].data[xy[0]] = value;\n  g_shared4[xy.y].data[xy[0]] = value;\n  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;\n}\nbool CheckMemory(ivec2 xy, float expected) {\n  if (g_shared1[xy.y][xy[0]] != expected) return false;\n  if (g_shared2[xy[1]][xy[0]] != expected) return false;\n  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;\n  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;\n  if (g_shared5[xy.y].data[xy.x] != expected) return false;\n  return true;\n}\nvoid main() {\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  vec4 result = vec4(0, 1, 0, 1);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1, 0, 0, 1);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1, 0, 0, 1);\n\n  if (g_true && gl_LocalInvocationID.x < 10) {\n    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);\n    Sync();\n    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1, 0, 0, 1);\n  }\n\n  imageStore(g_result_image, thread_xy, result);\n}"
             ,&local_59);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&data);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&data);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar2) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data,0x10,(allocator_type *)&local_59);
    textures = &this->m_texture;
    glu::CallLogWrapper::glGenTextures(this_00,1,textures);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8814,4,4,0,0x1908,0x1406,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    glu::CallLogWrapper::glBindImageTexture(this_00,3,this->m_texture,0,'\0',0,0x88b9,0x8814);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data,0x10,(allocator_type *)&local_59);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    glu::CallLogWrapper::glGetTexImage
              (this_00,0xde1,0,0x1908,0x1406,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    lVar6 = 0;
    uVar5 = 0;
    while( true ) {
      uVar7 = (long)data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (uVar7 <= uVar5) break;
      tcu::Vector<float,_4>::Vector
                (&local_38,
                 (Vector<float,_4> *)
                 ((long)(data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar6));
      auVar1._4_4_ = -(uint)(local_38.m_data[1] != 1.0);
      auVar1._0_4_ = -(uint)(local_38.m_data[0] != 0.0);
      auVar1._8_4_ = -(uint)(local_38.m_data[2] != 0.0);
      auVar1._12_4_ = -(uint)(local_38.m_data[3] != 1.0);
      iVar4 = movmskps(extraout_EAX,auVar1);
      if (iVar4 != 0) {
        anon_unknown_0::Output("Invalid data at index %d.\n",uVar5);
        break;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    }
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    lVar6 = -(ulong)(uVar5 < uVar7);
  }
  else {
    lVar6 = -1;
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs = NL
			"layout(binding = 3, rgba32f) uniform image2D g_result_image;" NL
			"layout (local_size_x = 4,local_size_y=4 ) in;" NL "shared vec4 g_shared1[4];" NL
			"shared mat4 g_shared2;" NL "shared struct {" NL "  float data[4];" NL "} g_shared3[4];" NL
			"shared struct Type { float data[4]; } g_shared4[4];" NL "shared Type g_shared5[4];" NL
			"uniform bool g_true = true;" NL
			"uniform float g_values[16] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };" NL NL
			"void Sync() {" NL "  groupMemoryBarrier();" NL "  barrier();" NL "}" NL
			"void SetMemory(ivec2 xy, float value) {" NL "  g_shared1[xy.y][gl_LocalInvocationID.x] = value;" NL
			"  g_shared2[xy.y][xy.x] = value;" NL "  g_shared3[xy[1]].data[xy[0]] = value;" NL
			"  g_shared4[xy.y].data[xy[0]] = value;" NL
			"  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;" NL "}" NL
			"bool CheckMemory(ivec2 xy, float expected) {" NL
			"  if (g_shared1[xy.y][xy[0]] != expected) return false;" NL
			"  if (g_shared2[xy[1]][xy[0]] != expected) return false;" NL
			"  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;" NL
			"  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;" NL
			"  if (g_shared5[xy.y].data[xy.x] != expected) return false;" NL "  return true;" NL "}" NL
			"void main() {" NL "  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
			"  vec4 result = vec4(0, 1, 0, 1);" NL NL
			"  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);" NL "  Sync();" NL
			"  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1, 0, 0, 1);" NL NL
			"  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);" NL "  Sync();" NL
			"  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1, 0, 0, 1);" NL NL
			"  if (g_true && gl_LocalInvocationID.x < 10) {" NL
			"    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);" NL "    Sync();" NL
			"    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1, 0, 0, 1);" NL
			"  }" NL NL "  imageStore(g_result_image, thread_xy, result);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init texture */
		{
			std::vector<vec4> data(4 * 4);
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 4, 4, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glBindImageTexture(3, m_texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);

		/* validate render target */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(0, 1, 0, 1)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}